

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int ifr_count_tiles(igsc_device_handle *handle)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint16_t supported_tiles;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 3;
  do {
    uVar1 = igsc_ifr_count_tiles(handle,&supported_tiles);
    if (uVar1 != 0xd) {
      if (uVar1 == 0) {
        iVar2 = 0;
        printf("Number of supported tiles: %u\n",(ulong)supported_tiles);
        goto LAB_0010a7ea;
      }
      break;
    }
    usleep(2000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (quiet == '\0') {
    fprintf(_stderr,"Error: Failed to run ifr count tiles, library return code %d\n",(ulong)uVar1);
  }
  print_device_fw_status(handle);
  iVar2 = 1;
LAB_0010a7ea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

mockable_static
int ifr_count_tiles(struct igsc_device_handle *handle)
{
    int ret;
    uint16_t supported_tiles;
    unsigned int retries = 0;

    /* call the igsc library routine to run ifr count tiles */
    while ((ret = igsc_ifr_count_tiles(handle, &supported_tiles)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to run ifr count tiles, library return code %d\n", ret);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of supported tiles: %u\n", supported_tiles);

    return ret;
}